

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

bool __thiscall
re2::Prog::SearchNFA
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  StringPiece *submatch;
  bool bVar1;
  int nsubmatch;
  StringPiece *pSVar2;
  StringPiece sp;
  NFA nfa;
  StringPiece local_e8;
  NFA local_d0;
  
  NFA::NFA(&local_d0,this);
  local_e8.data_ = (const_pointer)0x0;
  local_e8.size_ = 0;
  pSVar2 = match;
  if (nmatch == 0) {
    pSVar2 = &local_e8;
  }
  nsubmatch = nmatch + (uint)(nmatch == 0);
  submatch = pSVar2;
  if (kind != kFullMatch) {
    nsubmatch = nmatch;
    submatch = match;
  }
  bVar1 = NFA::Search(&local_d0,text,context,anchor == kAnchored || kind == kFullMatch,
                      kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch == 0) {
        match = &local_e8;
      }
      if (pSVar2->data_ + match->size_ != text->data_ + text->size_) goto LAB_001b5f8c;
    }
    bVar1 = true;
  }
  else {
LAB_001b5f8c:
    bVar1 = false;
  }
  NFA::~NFA(&local_d0);
  return bVar1;
}

Assistant:

bool
Prog::SearchNFA(const StringPiece& text, const StringPiece& context,
                Anchor anchor, MatchKind kind,
                StringPiece* match, int nmatch) {
  if (ExtraDebug)
    Dump();

  NFA nfa(this);
  StringPiece sp;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch == 0) {
      match = &sp;
      nmatch = 1;
    }
  }
  if (!nfa.Search(text, context, anchor == kAnchored, kind != kFirstMatch, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}